

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInternalFormatQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::SamplesBufferSizeCase::test(SamplesBufferSizeCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  TestContext *this_02;
  bool bVar1;
  GLint queryTargetValue;
  StateQueryMemoryWriteGuard<int> sampleCounts;
  GLint local_1a8;
  StateQueryMemoryWriteGuard<int> local_1a4;
  undefined1 local_198 [384];
  
  local_1a4.m_preguard = -0x21212122;
  local_1a4.m_value = -0x21212122;
  local_1a4.m_postguard = -0x21212122;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetInternalformativ
            (this_00,0x8d41,this->m_internalFormat,0x9380,1,&local_1a4.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1a4,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (bVar1) {
    local_1a8 = -1;
    glu::CallLogWrapper::glGetInternalformativ
              (this_00,0x8d41,this->m_internalFormat,0x9380,0,&local_1a8);
    ApiCase::expectError(&this->super_ApiCase,0);
    if (local_1a8 != -1) {
      local_198._0_8_ =
           ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_01 = (ostringstream *)(local_198 + 8);
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"// ERROR: Expected output variable not to be written to.",0x38)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
      this_02 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (this_02->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(this_02,QP_TEST_RESULT_FAIL,"got invalid write");
      }
    }
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		StateQueryMemoryWriteGuard<GLint> sampleCounts;
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 1, &sampleCounts);
		expectError(GL_NO_ERROR);

		if (!sampleCounts.verifyValidity(m_testCtx))
			return;

		// test with bufSize = 0
		GLint queryTargetValue = -1;
		glGetInternalformativ(GL_RENDERBUFFER, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 0, &queryTargetValue);
		expectError(GL_NO_ERROR);

		if (queryTargetValue != -1)
		{
			m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected output variable not to be written to." << TestLog::EndMessage;
			if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid write");
		}
	}